

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds.cpp
# Opt level: O1

void __thiscall Block::print_data(Block *this,ProxyWithLink *cp)

{
  undefined1 auVar1 [16];
  pointer piVar2;
  ulong uVar3;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  ulong local_38 [2];
  
  local_38[0] = (ulong)(uint)(cp->super_Proxy).gid_;
  format_str.size_ = 8;
  format_str.data_ = "gid {}:\n";
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_38;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 1;
  fmt::v7::vprint(_stderr,format_str,args);
  piVar2 = (this->vals).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vals).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar3 = 0;
    do {
      local_38[0] = (ulong)(uint)piVar2[uVar3];
      format_str_00.size_ = 3;
      format_str_00.data_ = "{} ";
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_38;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 1;
      fmt::v7::vprint(_stderr,format_str_00,args_00);
      uVar3 = uVar3 + 1;
      piVar2 = (this->vals).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->vals).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  local_38[0] = 0;
  format_str_01.size_ = 1;
  format_str_01.data_ = "\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_38;
  fmt::v7::vprint(_stderr,format_str_01,(format_args)(auVar1 << 0x40));
  return;
}

Assistant:

void print_data(const diy::Master::ProxyWithLink&     cp)
    {
        fmt::print(stderr, "gid {}:\n", cp.gid());
        for (size_t i = 0; i < vals.size(); i++)
            fmt::print(stderr, "{} ", vals[i]);
        fmt::print(stderr, "\n");
    }